

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

void libcellml::findAndReplaceComponentCnUnitsNames
               (ComponentPtr *component,string *oldName,string *newName)

{
  bool bVar1;
  byte bVar2;
  pointer psVar3;
  XmlNodePtr rootNode;
  vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  mathDocs;
  string newMathContent;
  string mathContent;
  string newMath;
  string originalMath;
  XmlNodePtr local_f0;
  ComponentPtr *local_e0;
  string *local_d8;
  string *local_d0;
  vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_d8 = oldName;
  local_d0 = newName;
  Component::math_abi_cxx11_
            (&local_90,
             (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  if (local_90._M_string_length != 0) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    local_e0 = component;
    multiRootXml(&local_c8,&local_90);
    bVar2 = 0;
    for (psVar3 = local_c8.
                  super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar3 != local_c8.
                  super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; psVar3 = psVar3 + 1) {
      XmlDoc::rootNode((XmlDoc *)&local_f0);
      bVar1 = XmlNode::isMathmlElement
                        (local_f0.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,"math");
      if (bVar1) {
        XmlNode::convertToString_abi_cxx11_
                  (&local_50,
                   local_f0.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        findAndReplaceCnUnitsNames(&local_f0,local_d8,local_d0);
        XmlNode::convertToString_abi_cxx11_
                  (&local_70,
                   local_f0.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        std::__cxx11::string::append((string *)&local_b0);
        bVar1 = std::operator!=(&local_70,&local_50);
        bVar2 = bVar2 | bVar1;
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_f0.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    if (bVar2 != 0) {
      Component::setMath((local_e0->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,&local_b0);
    }
    std::
    vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
    ::~vector(&local_c8);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void findAndReplaceComponentCnUnitsNames(const ComponentPtr &component, const std::string &oldName, const std::string &newName)
{
    std::string mathContent = component->math();
    if (mathContent.empty()) {
        return;
    }
    bool contentModified = false;
    std::string newMathContent;
    std::vector<XmlDocPtr> mathDocs = multiRootXml(mathContent);
    for (const auto &doc : mathDocs) {
        auto rootNode = doc->rootNode();
        if (rootNode->isMathmlElement("math")) {
            auto originalMath = rootNode->convertToString();
            findAndReplaceCnUnitsNames(rootNode, oldName, newName);
            auto newMath = rootNode->convertToString();
            newMathContent += newMath;
            if (newMath != originalMath) {
                contentModified = true;
            }
        }
    }

    if (contentModified) {
        component->setMath(newMathContent);
    }
}